

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O2

void __thiscall Rml::DecoratorShader::~DecoratorShader(DecoratorShader *this)

{
  ~DecoratorShader(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

DecoratorShader::~DecoratorShader() {}